

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNon virtual_or_non,Printer *printer)

{
  int iVar1;
  undefined8 *in_RDI;
  Formatter *in_stack_00000040;
  Options *in_stack_00000048;
  MethodDescriptor *in_stack_00000050;
  Formatter format;
  MethodDescriptor *method;
  int i;
  Printer *in_stack_ffffffffffffff38;
  Formatter *in_stack_ffffffffffffff40;
  allocator<char> local_91;
  string local_90 [8];
  char *in_stack_ffffffffffffff78;
  Formatter *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Formatter *in_stack_ffffffffffffffc0;
  int local_1c;
  
  for (local_1c = 0; iVar1 = ServiceDescriptor::method_count((ServiceDescriptor *)*in_RDI),
      local_1c < iVar1; local_1c = local_1c + 1) {
    ServiceDescriptor::method((ServiceDescriptor *)*in_RDI,local_1c);
    Formatter::Formatter
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x5213c8);
    anon_unknown_3::InitMethodVariables(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    in_stack_ffffffffffffff40 = (Formatter *)&local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"virtual",(allocator *)in_stack_ffffffffffffff40);
    Formatter::Set<char_const*>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    Formatter::operator()<>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Formatter::~Formatter((Formatter *)0x521473);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNon virtual_or_non,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format.Set("virtual", virtual_or_non == VIRTUAL ? "virtual " : "");
    format(
        "$virtual$void $name$(::$proto_ns$::RpcController* controller,\n"
        "                     const $input_type$* request,\n"
        "                     $output_type$* response,\n"
        "                     ::google::protobuf::Closure* done);\n");
  }
}